

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int update_1rtt_key(quicly_conn_t *conn,ptls_cipher_suite_t *cipher,int is_enc,
                   ptls_aead_context_t **aead,uint8_t *secret)

{
  size_t outlen;
  int iVar1;
  ptls_iovec_t secret_00;
  ptls_aead_context_t *new_aead;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  uint8_t new_secret [64];
  
  new_aead = (ptls_aead_context_t *)0x0;
  outlen = cipher->hash->digest_size;
  local_88 = 0;
  uStack_80 = 0;
  secret_00.len = outlen;
  secret_00.base = secret;
  local_8c = is_enc;
  iVar1 = ptls_hkdf_expand_label
                    (cipher->hash,new_secret,outlen,secret_00,"quic ku",(ptls_iovec_t)ZEXT816(0),
                     (char *)0x0);
  if (iVar1 == 0) {
    iVar1 = setup_cipher(conn,3,local_8c,(ptls_cipher_context_t **)0x0,&new_aead,cipher->aead,
                         cipher->hash,new_secret);
    if (iVar1 == 0) {
      if (*aead != (ptls_aead_context_t *)0x0) {
        ptls_aead_free(*aead);
      }
      *aead = new_aead;
      new_aead = (ptls_aead_context_t *)0x0;
      memcpy(secret,new_secret,cipher->hash->digest_size);
      iVar1 = 0;
    }
    else if (new_aead != (ptls_aead_context_t *)0x0) {
      ptls_aead_free(new_aead);
    }
  }
  (*ptls_clear_memory)(new_secret,cipher->hash->digest_size);
  return iVar1;
}

Assistant:

static int update_1rtt_key(quicly_conn_t *conn, ptls_cipher_suite_t *cipher, int is_enc, ptls_aead_context_t **aead,
                           uint8_t *secret)
{
    uint8_t new_secret[PTLS_MAX_DIGEST_SIZE];
    ptls_aead_context_t *new_aead = NULL;
    int ret;

    /* generate next AEAD key */
    if ((ret = ptls_hkdf_expand_label(cipher->hash, new_secret, cipher->hash->digest_size,
                                      ptls_iovec_init(secret, cipher->hash->digest_size), "quic ku", ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_1RTT, is_enc, NULL, &new_aead, cipher->aead, cipher->hash, new_secret)) != 0)
        goto Exit;

    /* success! update AEAD and secret */
    if (*aead != NULL)
        ptls_aead_free(*aead);
    *aead = new_aead;
    new_aead = NULL;
    memcpy(secret, new_secret, cipher->hash->digest_size);

    ret = 0;
Exit:
    if (new_aead != NULL)
        ptls_aead_free(new_aead);
    ptls_clear_memory(new_secret, cipher->hash->digest_size);
    return ret;
}